

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utLWSImportExport.cpp
# Opt level: O2

void __thiscall
utLWSImportExport_importLWSmove_x_post_constant_Test::TestBody
          (utLWSImportExport_importLWSmove_x_post_constant_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  Importer importer;
  AssertionResult gtest_ar;
  aiScene *scene;
  
  Assimp::Importer::Importer(&importer);
  scene = Assimp::Importer::ReadFile
                    (&importer,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/LWS/move_x_post_constant.lws"
                     ,0x400);
  local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&gtest_ar,"nullptr","scene",&local_38.ptr_,&scene);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utLWSImportExport.cpp"
               ,0x80,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Assimp::Importer::~Importer(&importer);
  return;
}

Assistant:

TEST_F(utLWSImportExport, importLWSmove_x_post_constant) {
    ::Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/LWS/move_x_post_constant.lws", aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);
}